

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

ssize_t __thiscall Reader::read(Reader *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<Gate,_std::allocator<Gate>_> *this_00;
  char cVar1;
  Reader *pRVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  reference pvVar4;
  uint uVar5;
  undefined4 uVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  pointer pbVar8;
  int x;
  undefined4 uVar9;
  ulong __n;
  pointer this_02;
  size_type __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Reader *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string s;
  
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(in_register_00000034,__fd);
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s.field_2._M_local_buf[0] = '\0';
  uVar5 = 0;
  __pos = 0;
  local_80 = this;
  while( true ) {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (this_01,'\n',__pos);
    if (sVar3 == 0xffffffffffffffff) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_a0,this_01,__pos,sVar3 - __pos);
    __x = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&s,&local_a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&lines,__x);
    std::__cxx11::string::~string((string *)&local_a0);
    if ((int)uVar5 <= (int)(uint)s._M_string_length) {
      uVar5 = (uint)s._M_string_length;
    }
    __pos = sVar3 + 1;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_a0,this_01,__pos,0xffffffffffffffff);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&lines,&local_a0);
  pRVar2 = local_80;
  std::__cxx11::string::~string((string *)&local_a0);
  pbVar8 = lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = lines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != pbVar8; this_02 = this_02 + 1
      ) {
    while (this_02->_M_string_length < (ulong)uVar5) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (this_02," ");
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&pRVar2->lns,&lines);
  this_00 = &pRVar2->gts;
  pbVar8 = (pRVar2->lns).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = 0;
  do {
    if ((ulong)((long)(local_80->lns).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= uVar7) {
      std::__cxx11::string::~string((string *)&s);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&lines);
      return (ssize_t)local_80;
    }
    for (__n = 0; __n < pbVar8[uVar7]._M_string_length; __n = __n + 1) {
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (pbVar8 + uVar7,__n);
      cVar1 = *pvVar4;
      uVar9 = (undefined4)__n;
      uVar6 = (undefined4)uVar7;
      if (cVar1 == '-') {
LAB_001048fe:
        local_a0._M_dataplus._M_p._0_4_ = uVar9;
        local_a0._M_dataplus._M_p._4_4_ = uVar6;
        std::vector<Wall,_std::allocator<Wall>_>::emplace_back<Wall>
                  (&local_80->wls,(Wall *)&local_a0);
      }
      else if (cVar1 == '.') {
        local_a0._M_dataplus._M_p._0_4_ = uVar9;
        local_a0._M_dataplus._M_p._4_4_ = uVar6;
        std::vector<Pheromone,_std::allocator<Pheromone>_>::emplace_back<Pheromone>
                  (&pRVar2->phrs,(Pheromone *)&local_a0);
      }
      else if (cVar1 == '~') {
        local_a0._M_string_length._0_4_ = 3;
        local_a0._M_dataplus._M_p._0_4_ = uVar9;
        local_a0._M_dataplus._M_p._4_4_ = uVar6;
        std::vector<Gate,_std::allocator<Gate>_>::emplace_back<Gate>(this_00,(Gate *)&local_a0);
      }
      else if (cVar1 == '<') {
        local_a0._M_string_length._0_4_ = 0;
        local_a0._M_dataplus._M_p._0_4_ = uVar9;
        local_a0._M_dataplus._M_p._4_4_ = uVar6;
        std::vector<Gate,_std::allocator<Gate>_>::emplace_back<Gate>(this_00,(Gate *)&local_a0);
      }
      else if (cVar1 == '>') {
        local_a0._M_string_length._0_4_ = 2;
        local_a0._M_dataplus._M_p._0_4_ = uVar9;
        local_a0._M_dataplus._M_p._4_4_ = uVar6;
        std::vector<Gate,_std::allocator<Gate>_>::emplace_back<Gate>(this_00,(Gate *)&local_a0);
      }
      else if (cVar1 == '^') {
        local_a0._M_string_length._0_4_ = 1;
        local_a0._M_dataplus._M_p._0_4_ = uVar9;
        local_a0._M_dataplus._M_p._4_4_ = uVar6;
        std::vector<Gate,_std::allocator<Gate>_>::emplace_back<Gate>(this_00,(Gate *)&local_a0);
      }
      else {
        if (cVar1 == '|') goto LAB_001048fe;
        if (cVar1 == ':') {
          local_a0._M_dataplus._M_p._0_4_ = 0;
          local_a0._M_dataplus._M_p._4_4_ = uVar9;
          local_a0._M_string_length._0_4_ = uVar6;
          local_a0._M_string_length._4_4_ = uVar9;
          local_a0.field_2._M_allocated_capacity._0_4_ = uVar6;
          std::vector<Ant,_std::allocator<Ant>_>::emplace_back<Ant>(&pRVar2->nts,(Ant *)&local_a0);
        }
      }
      pbVar8 = (pRVar2->lns).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

Reader& read(const string & text) {
            vector<string> lines;
            string::size_type pos;
            string::size_type prev = 0;
            int width = 0;

            string s;
            while ((pos = text.find('\n', prev)) != string::npos) {
                lines.push_back(s = text.substr(prev, pos - prev));
                int sz = (int)(s.size());
                width = max(sz, width);
                prev = pos + 1;
            } lines.push_back(text.substr(prev));

            for (auto & line : lines) while (line.size() < width)
                line.append(" ");

            this -> lns = lines;

            for (int y = 0; y < lns.size(); y++) for (int x = 0; x < lns[y].size(); x++) {
                char c = lns[y].at(x);
                if (c == ':')
                    nts.emplace_back(Ant(x, y));
                else if (c == '.')
                    phrs.emplace_back(Pheromone(x, y));
                else if (c == '-' || c == '|')
                    wls.emplace_back(Wall(x, y));
                else if (c == '>')
                    gts.emplace_back(Gate(x, y, 2));
                else if (c == '^')
                    gts.emplace_back(Gate(x, y, 1));
                else if (c == '<')
                    gts.emplace_back(Gate(x, y, 0));
                else if (c == '~')
                    gts.emplace_back(Gate(x, y, 3));
            }

            return *this;
        }